

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O0

void __thiscall Handler::Output(Handler *this,uint16_t *startDay,uint16_t *endDay)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  reference pRVar5;
  ushort *in_RDX;
  ushort *in_RSI;
  long in_RDI;
  RequestResult *requestRes;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<RequestResult,_std::allocator<RequestResult>_> *__range2_2;
  vector<RequestResult,_std::allocator<RequestResult>_> *requestResult;
  MigrateResult *migrateRes;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<MigrateResult,_std::allocator<MigrateResult>_> *__range2_1;
  vector<MigrateResult,_std::allocator<MigrateResult>_> *migrateResult;
  ExtendResult *extendRes;
  const_iterator __end2;
  const_iterator __begin2;
  vector<ExtendResult,_std::allocator<ExtendResult>_> *__range2;
  vector<ExtendResult,_std::allocator<ExtendResult>_> *extendResult;
  Result *res;
  uint16_t i;
  vector<ExtendResult,_std::allocator<ExtendResult>_> *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  __normal_iterator<const_RequestResult_*,_std::vector<RequestResult,_std::allocator<RequestResult>_>_>
  local_90;
  vector<RequestResult,_std::allocator<RequestResult>_> *local_88;
  vector<RequestResult,_std::allocator<RequestResult>_> *local_80;
  reference local_78;
  MigrateResult *local_70;
  __normal_iterator<const_MigrateResult_*,_std::vector<MigrateResult,_std::allocator<MigrateResult>_>_>
  local_68;
  vector<MigrateResult,_std::allocator<MigrateResult>_> *local_60;
  vector<MigrateResult,_std::allocator<MigrateResult>_> *local_58;
  reference local_50;
  ExtendResult *local_48;
  __normal_iterator<const_ExtendResult_*,_std::vector<ExtendResult,_std::allocator<ExtendResult>_>_>
  local_40;
  reference local_38;
  reference local_30;
  reference local_28;
  ushort local_1a;
  ushort *local_18;
  
  local_18 = in_RDX;
  for (local_1a = *in_RSI; local_1a < *local_18; local_1a = local_1a + 1) {
    local_30 = std::vector<Result,_std::allocator<Result>_>::operator[]
                         ((vector<Result,_std::allocator<Result>_> *)(in_RDI + 0x66a18),
                          (ulong)local_1a);
    local_28 = local_30;
    poVar2 = std::operator<<((ostream *)&std::cout,"(purchase, ");
    sVar3 = std::vector<ExtendResult,_std::allocator<ExtendResult>_>::size(&local_30->extendResult);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::operator<<(poVar2,")\n");
    local_38 = local_30;
    local_40._M_current =
         (ExtendResult *)
         std::vector<ExtendResult,_std::allocator<ExtendResult>_>::begin(in_stack_ffffffffffffff38);
    local_48 = (ExtendResult *)
               std::vector<ExtendResult,_std::allocator<ExtendResult>_>::end
                         (in_stack_ffffffffffffff38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_ExtendResult_*,_std::vector<ExtendResult,_std::allocator<ExtendResult>_>_>
                               *)in_stack_ffffffffffffff40,
                              (__normal_iterator<const_ExtendResult_*,_std::vector<ExtendResult,_std::allocator<ExtendResult>_>_>
                               *)in_stack_ffffffffffffff38), bVar1) {
      local_50 = __gnu_cxx::
                 __normal_iterator<const_ExtendResult_*,_std::vector<ExtendResult,_std::allocator<ExtendResult>_>_>
                 ::operator*(&local_40);
      poVar2 = std::operator<<((ostream *)&std::cout,"(");
      pvVar4 = std::vector<Server,_std::allocator<Server>_>::operator[]
                         ((vector<Server,_std::allocator<Server>_> *)(in_RDI + 0x30),
                          (ulong)local_50->serverIdx);
      poVar2 = std::operator<<(poVar2,(string *)pvVar4);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_50->purchaseNum);
      std::operator<<(poVar2,")\n");
      __gnu_cxx::
      __normal_iterator<const_ExtendResult_*,_std::vector<ExtendResult,_std::allocator<ExtendResult>_>_>
      ::operator++(&local_40);
    }
    local_58 = &local_28->migrateResult;
    in_stack_ffffffffffffff40 = std::operator<<((ostream *)&std::cout,"(migration, ");
    sVar3 = std::vector<MigrateResult,_std::allocator<MigrateResult>_>::size(local_58);
    poVar2 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff40,sVar3);
    std::operator<<(poVar2,")\n");
    local_60 = local_58;
    local_68._M_current =
         (MigrateResult *)
         std::vector<MigrateResult,_std::allocator<MigrateResult>_>::begin
                   ((vector<MigrateResult,_std::allocator<MigrateResult>_> *)
                    in_stack_ffffffffffffff38);
    local_70 = (MigrateResult *)
               std::vector<MigrateResult,_std::allocator<MigrateResult>_>::end
                         ((vector<MigrateResult,_std::allocator<MigrateResult>_> *)
                          in_stack_ffffffffffffff38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_MigrateResult_*,_std::vector<MigrateResult,_std::allocator<MigrateResult>_>_>
                               *)in_stack_ffffffffffffff40,
                              (__normal_iterator<const_MigrateResult_*,_std::vector<MigrateResult,_std::allocator<MigrateResult>_>_>
                               *)in_stack_ffffffffffffff38), bVar1) {
      local_78 = __gnu_cxx::
                 __normal_iterator<const_MigrateResult_*,_std::vector<MigrateResult,_std::allocator<MigrateResult>_>_>
                 ::operator*(&local_68);
      if (local_78->location == ALL) {
        poVar2 = std::operator<<((ostream *)&std::cout,"(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_78->vmId);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_78->purchasedServerId);
        std::operator<<(poVar2,")\n");
      }
      else if (local_78->location == NODE_A) {
        poVar2 = std::operator<<((ostream *)&std::cout,"(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_78->vmId);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_78->purchasedServerId);
        std::operator<<(poVar2,", A)\n");
      }
      else if (local_78->location == NODE_B) {
        poVar2 = std::operator<<((ostream *)&std::cout,"(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_78->vmId);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_78->purchasedServerId);
        std::operator<<(poVar2,", B)\n");
      }
      __gnu_cxx::
      __normal_iterator<const_MigrateResult_*,_std::vector<MigrateResult,_std::allocator<MigrateResult>_>_>
      ::operator++(&local_68);
    }
    local_88 = &local_28->requestResult;
    local_80 = local_88;
    local_90._M_current =
         (RequestResult *)
         std::vector<RequestResult,_std::allocator<RequestResult>_>::begin
                   ((vector<RequestResult,_std::allocator<RequestResult>_> *)
                    in_stack_ffffffffffffff38);
    std::vector<RequestResult,_std::allocator<RequestResult>_>::end
              ((vector<RequestResult,_std::allocator<RequestResult>_> *)in_stack_ffffffffffffff38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_RequestResult_*,_std::vector<RequestResult,_std::allocator<RequestResult>_>_>
                               *)in_stack_ffffffffffffff40,
                              (__normal_iterator<const_RequestResult_*,_std::vector<RequestResult,_std::allocator<RequestResult>_>_>
                               *)in_stack_ffffffffffffff38), bVar1) {
      pRVar5 = __gnu_cxx::
               __normal_iterator<const_RequestResult_*,_std::vector<RequestResult,_std::allocator<RequestResult>_>_>
               ::operator*(&local_90);
      if (pRVar5->location == ALL) {
        poVar2 = std::operator<<((ostream *)&std::cout,"(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pRVar5->purchasedServerId);
        std::operator<<(poVar2,")\n");
      }
      else if (pRVar5->location == NODE_A) {
        poVar2 = std::operator<<((ostream *)&std::cout,"(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pRVar5->purchasedServerId);
        std::operator<<(poVar2,", A)\n");
      }
      else if (pRVar5->location == NODE_B) {
        poVar2 = std::operator<<((ostream *)&std::cout,"(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pRVar5->purchasedServerId);
        std::operator<<(poVar2,", B)\n");
      }
      __gnu_cxx::
      __normal_iterator<const_RequestResult_*,_std::vector<RequestResult,_std::allocator<RequestResult>_>_>
      ::operator++(&local_90);
    }
  }
  fflush(_stdout);
  return;
}

Assistant:

void Handler::Output(const uint16_t &startDay, const uint16_t &endDay) {
    for (uint16_t i = startDay; i < endDay; ++i) {
        const Result &res = result[i];

        // 扩容结果
        const std::vector<ExtendResult> &extendResult = res.extendResult;
        std::cout << "(purchase, " << extendResult.size() << ")\n";
        for (const ExtendResult &extendRes : extendResult) {
            std::cout << "(" << servers[extendRes.serverIdx].model << ", " << extendRes.purchaseNum << ")\n";
        }

        // 迁移结果
        const std::vector<MigrateResult> &migrateResult = res.migrateResult;
        std::cout << "(migration, " << migrateResult.size() << ")\n";
        for (const MigrateResult &migrateRes : migrateResult) {
            if (migrateRes.location == ALL) {
                std::cout << "(" << migrateRes.vmId << ", " << migrateRes.purchasedServerId << ")\n";
            } else if (migrateRes.location == NODE_A) {
                std::cout << "(" << migrateRes.vmId << ", " << migrateRes.purchasedServerId << ", A)\n";
            } else if (migrateRes.location == NODE_B) {
                std::cout << "(" << migrateRes.vmId << ", " << migrateRes.purchasedServerId << ", B)\n";
            }
        }

        // 部署结果
        const std::vector<RequestResult> &requestResult = res.requestResult;
        for (const RequestResult &requestRes : requestResult) {
            if (requestRes.location == ALL) {
                std::cout << "(" << requestRes.purchasedServerId << ")\n";
            } else if (requestRes.location == NODE_A) {
                std::cout << "(" << requestRes.purchasedServerId << ", A)\n";
            } else if (requestRes.location == NODE_B) {
                std::cout << "(" << requestRes.purchasedServerId << ", B)\n";
            }
        }
    }

    fflush(stdout);
}